

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O2

void __thiscall
TaprootScriptTree_Empty_Test::~TaprootScriptTree_Empty_Test(TaprootScriptTree_Empty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TaprootScriptTree, Empty) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  TaprootScriptTree tree;
  uint8_t ver = TaprootScriptTree::kTapScriptLeafVersion;
  EXPECT_EQ(ver, tree.GetLeafVersion());
  EXPECT_EQ("83d956a5b36109f8f667aa9b366e8479942e32396455b5f43b6df917768e4d45",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("83d956a5b36109f8f667aa9b366e8479942e32396455b5f43b6df917768e4d45",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("350105043b07771830fe4e4bd1a694d6aba22eb6e7f953d530f49b581d816bec",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("023534977a61f3167b576ee7e636a4041d6451a58f708da24fac8bbd2d9e6b25",
      tree.GetTweakedPrivkey(key).GetHex());
  EXPECT_FALSE(tree.IsValid());
  EXPECT_EQ("tl()", tree.ToString());

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));
}